

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O3

void __thiscall PSAC_RepeatsAll_Test::TestBody(PSAC_RepeatsAll_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *in_R9;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  comm c;
  string str;
  string local_str;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  sa;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  AssertHelper local_248;
  internal local_240 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  undefined1 local_230 [32];
  comm local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [32];
  ompi_communicator_t *local_190 [2];
  ompi_communicator_t local_180 [16];
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  char local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  unsigned_long *local_110 [2];
  unsigned_long local_100 [27];
  
  local_210._vptr_comm = (_func_int **)&PTR__comm_001aae50;
  local_210.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
  MPI_Comm_size(&ompi_mpi_comm_world,&local_210.m_size);
  MPI_Comm_rank(local_210.mpi_comm,&local_210.m_rank);
  local_210.do_free = false;
  paVar1 = &local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  if (local_210.m_rank == 0) {
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"helloworld","");
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"blahlablah","");
    local_170._M_current = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"ellow","");
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"worldblah","");
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"rld","");
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"hello","");
    __l._M_len = 6;
    __l._M_array = (iterator)local_1b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_230,__l,(allocator_type *)&local_1d0);
    lVar5 = 0;
    do {
      if ((void *)((long)local_100 + lVar5) != *(void **)((long)local_110 + lVar5)) {
        operator_delete(*(void **)((long)local_110 + lVar5));
      }
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0xc0);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    lVar5 = 15000;
    do {
      iVar3 = rand();
      lVar4 = ((ulong)(long)iVar3 % (ulong)((long)(local_230._8_8_ - local_230._0_8_) >> 5)) * 0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x10),*(char **)(local_230._0_8_ + lVar4),
                 *(long *)(local_230._0_8_ + lVar4 + 8));
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)local_130);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_230);
  }
  mxx::impl::
  distribute_container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::stable_distribute(&local_1d0,&local_1f0,&local_210);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                  *)local_1b0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_1d0._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_1d0._M_dataplus._M_p + local_1d0._M_string_length),&local_210);
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::construct((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
               *)local_1b0,true,0);
  local_240[0] = (internal)
                 check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                           ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                             *)local_1b0,&local_1f0,&local_210);
  local_238.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_240[0]) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_238,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_240[0] = (internal)
                   check_sa_eqdss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                             ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                               *)local_1b0,&local_1f0,&local_210);
    local_238.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_240[0]) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_238,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
      ::construct((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                   *)local_1b0,true,3);
      local_240[0] = (internal)
                     check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                               ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                 *)local_1b0,&local_1f0,&local_210);
      local_238.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((bool)local_240[0]) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_238,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_240[0] = (internal)
                       check_sa_eqdss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                                 ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                   *)local_1b0,&local_1f0,&local_210);
        local_238.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_240[0]) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_238,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
          ::construct((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                       *)local_1b0,false,2);
          local_240[0] = (internal)
                         check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                                   ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                     *)local_1b0,&local_1f0,&local_210);
          local_238.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((bool)local_240[0]) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_238,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
            ::construct_arr<2ul>
                      ((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                        *)local_1b0,true);
            local_240[0] = (internal)
                           check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                                     ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                       *)local_1b0,&local_1f0,&local_210);
            local_238.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_240[0]) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_238,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
              ::construct_arr<3ul>
                        ((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                          *)local_1b0,true);
              local_240[0] = (internal)
                             check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                                       ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                         *)local_1b0,&local_1f0,&local_210);
              local_238.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if ((bool)local_240[0]) {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_238,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                ::construct_arr<3ul>
                          ((suffix_array<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                            *)local_1b0,false);
                local_240[0] = (internal)
                               check_sa_dss<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,false>
                                         ((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                                           *)local_1b0,&local_1f0,&local_210);
                local_238.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_240[0]) {
                  testing::Message::Message((Message *)&local_250);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_230,local_240,
                             (AssertionResult *)"check_sa_dss(sa, str, c)","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
                             ,0xc1,(char *)local_230._0_8_);
                  testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_250);
                  testing::internal::AssertHelper::~AssertHelper(&local_248);
                  if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
                    operator_delete((void *)local_230._0_8_);
                  }
                  if (local_250.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar2 = testing::internal::IsTrue(true);
                    if ((bVar2) &&
                       (local_250.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_250.ptr_ + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_238,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::Message::Message((Message *)&local_250);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_230,local_240,
                           (AssertionResult *)"check_sa_dss(sa, str, c)","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_248,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
                           ,0xbd,(char *)local_230._0_8_);
                testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_250);
                testing::internal::AssertHelper::~AssertHelper(&local_248);
                if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
                  operator_delete((void *)local_230._0_8_);
                }
                if (local_250.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar2 = testing::internal::IsTrue(true);
                  if ((bVar2) &&
                     (local_250.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_250.ptr_ + 8))();
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_238,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
            }
            else {
              testing::Message::Message((Message *)&local_250);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_230,local_240,(AssertionResult *)"check_sa_dss(sa, str, c)"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_248,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
                         ,0xb9,(char *)local_230._0_8_);
              testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_250);
              testing::internal::AssertHelper::~AssertHelper(&local_248);
              if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
                operator_delete((void *)local_230._0_8_);
              }
              if (local_250.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   (local_250.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_250.ptr_ + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_238,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
          }
          else {
            testing::Message::Message((Message *)&local_250);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_230,local_240,(AssertionResult *)"check_sa_dss(sa, str, c)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_248,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
                       ,0xb5,(char *)local_230._0_8_);
            testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_250);
            testing::internal::AssertHelper::~AssertHelper(&local_248);
            if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
              operator_delete((void *)local_230._0_8_);
            }
            if (local_250.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_250.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_250.ptr_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_238,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
        else {
          testing::Message::Message((Message *)&local_250);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_230,local_240,(AssertionResult *)"check_sa_eqdss(sa, str, c)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
                     ,0xb1,(char *)local_230._0_8_);
          testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_250);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_);
          }
          if (local_250.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_250.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_250.ptr_ + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_238,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
      else {
        testing::Message::Message((Message *)&local_250);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_230,local_240,(AssertionResult *)"check_sa_dss(sa, str, c)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_248,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
                   ,0xb0,(char *)local_230._0_8_);
        testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_248);
        if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
          operator_delete((void *)local_230._0_8_);
        }
        if (local_250.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_250.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_250.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_238,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
    }
    else {
      testing::Message::Message((Message *)&local_250);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_230,local_240,(AssertionResult *)"check_sa_eqdss(sa, str, c)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
                 ,0xac,(char *)local_230._0_8_);
      testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
        operator_delete((void *)local_230._0_8_);
      }
      if (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_250.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_250.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_238,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,local_240,(AssertionResult *)"check_sa_dss(sa, str, c)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_psac.cpp"
               ,0xab,(char *)local_230._0_8_);
    testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    if ((pointer)local_230._0_8_ != (pointer)(local_230 + 0x10)) {
      operator_delete((void *)local_230._0_8_);
    }
    if (local_250.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_250.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_250.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_238,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  ::~suffix_array((suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                   *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  mxx::comm::~comm(&local_210);
  return;
}

Assistant:

bool check_lcp_eq(suffix_array<Iterator, index_t, _LCP>& sa, const std::string& local_str, const mxx::comm& c) {
    // gather LCP back to root process
    std::vector<index_t> gsa = mxx::gatherv(sa.local_SA, 0, c);
    std::vector<index_t> gisa = mxx::gatherv(sa.local_B, 0, c);
    std::vector<index_t> glcp;
    if (_LCP)
        glcp = mxx::gatherv(sa.local_LCP, 0, c);
    // gather string
    // TODO: use iterator or std::string version for mxx?
    std::vector<char> global_str_vec = mxx::gatherv(&(*local_str.begin()), local_str.size(), 0, c);
    std::string gstr(global_str_vec.begin(), global_str_vec.end());
    bool sa_correct = true;
    if (c.rank() == 0) {
        sa_correct = dss::check(gstr.begin(), gstr.end(), gsa);
    }

    // check LCP
    bool lcp_correct = true;
    if (_LCP) {
        if (c.rank() == 0) {
            lcp_correct = check_lcp(gstr, gsa, gisa, glcp);
        }
    }
    return sa_correct && lcp_correct;
}